

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_fixture.c
# Opt level: O0

int read_file(char *path,char **out_buffer,size_t *out_len)

{
  FILE *__stream;
  size_t __size;
  char *__ptr;
  size_t sVar1;
  ssize_t len;
  char *buffer;
  FILE *fp;
  size_t *out_len_local;
  char **out_buffer_local;
  char *path_local;
  
  if (((out_buffer == (char **)0x0) || (out_len == (size_t *)0x0)) || (path == (char *)0x0)) {
    fprintf(_stderr,"invalid params.\n");
    path_local._4_4_ = 1;
  }
  else {
    *out_buffer = (char *)0x0;
    *out_len = 0;
    __stream = fopen(path,"r");
    if (__stream == (FILE *)0x0) {
      fprintf(_stderr,"File could not be read: %s\n",path);
      path_local._4_4_ = 1;
    }
    else {
      fseek(__stream,0,2);
      __size = ftell(__stream);
      if ((long)__size < 0) {
        fclose(__stream);
        fprintf(_stderr,"Could not determine input size of: %s\n",path);
        path_local._4_4_ = 1;
      }
      else {
        rewind(__stream);
        __ptr = (char *)calloc(1,__size + 1);
        if (__ptr == (char *)0x0) {
          fclose(__stream);
          fprintf(_stderr,"Could not alloc memory.\n");
          path_local._4_4_ = 1;
        }
        else {
          sVar1 = fread(__ptr,__size,1,__stream);
          if (sVar1 == 1) {
            fclose(__stream);
            *out_buffer = __ptr;
            *out_len = __size;
            path_local._4_4_ = 0;
          }
          else {
            fclose(__stream);
            free(__ptr);
            fprintf(_stderr,"Could not read file into memory.\n");
            path_local._4_4_ = 1;
          }
        }
      }
    }
  }
  return path_local._4_4_;
}

Assistant:

static int read_file(const char *path, char **out_buffer, size_t *out_len)
{
    FILE *fp;
    char *buffer;
    ssize_t len;

    if(!out_buffer || !out_len || !path) {
        fprintf(stderr, "invalid params.\n");
        return 1;
    }

    *out_buffer = NULL;
    *out_len = 0;

    fp = fopen(path, "r");

    if(!fp) {
        fprintf(stderr, "File could not be read: %s\n", path);
        return 1;
    }

    fseek(fp, 0L, SEEK_END);
    len = ftell(fp);
    if(len < 0) {
        fclose(fp);
        fprintf(stderr, "Could not determine input size of: %s\n", path);
        return 1;
    }
    rewind(fp);

    buffer = calloc(1, (size_t)len + 1);
    if(!buffer) {
        fclose(fp);
        fprintf(stderr, "Could not alloc memory.\n");
        return 1;
    }

    if(1 != fread(buffer, (size_t)len, 1, fp)) {
        fclose(fp);
        free(buffer);
        fprintf(stderr, "Could not read file into memory.\n");
        return 1;
    }

    fclose(fp);

    *out_buffer = buffer;
    *out_len = (size_t)len;

    return 0;
}